

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.c
# Opt level: O0

void test_init(void)

{
  long local_20;
  queue_t queue;
  
  fprintf(_stderr,"test_init() started\n");
  queue_init(&local_20);
  if ((int)queue.tail != 0) {
    __assert_fail("0 == queue.len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                  ,0x20,"void test_init()");
  }
  if (local_20 == 0) {
    if (queue.head == (qnode_t *)0x0) {
      fprintf(_stderr,"test_init() succeed\n");
      return;
    }
    __assert_fail("NULL == queue.tail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                  ,0x22,"void test_init()");
  }
  __assert_fail("NULL == queue.head",
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                ,0x21,"void test_init()");
}

Assistant:

void test_init()
{
    fprintf(stderr, "test_init() started\n");

    queue_t queue;

    queue_init(&queue);

    assert(0 == queue.len);
    assert(NULL == queue.head);
    assert(NULL == queue.tail);

    fprintf(stderr, "test_init() succeed\n");
}